

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O0

void nested_runs(uint w)

{
  code *pcVar1;
  byte extraout_AL;
  Enum EVar2;
  double __x;
  Expression_lhs<const_int_&> EVar3;
  ResultBuilder DOCTEST_RB;
  C c;
  int counter;
  Result *res;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff8f4;
  undefined8 in_stack_fffffffffffff8f8;
  int line;
  char *file;
  Enum in_stack_fffffffffffff90c;
  ResultBuilder *in_stack_fffffffffffff910;
  char *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  uint in_stack_fffffffffffff93c;
  C *in_stack_fffffffffffff940;
  C *in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff970;
  Expression_lhs<const_int_&> *in_stack_fffffffffffff978;
  char local_620 [1560];
  undefined4 local_8;
  
  line = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  local_8 = 0;
  file = local_620;
  nested_runs::C::C(in_stack_fffffffffffff940,in_stack_fffffffffffff93c,
                    (int *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
  nested_runs::C::run(in_stack_fffffffffffff950);
  res = (Result *)0x1ae920;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,file,line,
             (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),"",
             in_stack_fffffffffffff920);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffff924,DT_REQUIRE);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),(int *)res);
  EVar2 = EVar3.m_at;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar2,in_stack_fffffffffffff8f0),res);
  doctest::detail::Result::~Result((Result *)0x126ce4);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffff958,__x);
  uVar4 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff8f0);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar2,uVar4));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x126dbb);
    nested_runs::C::~C((C *)CONCAT44(EVar2,uVar4));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void nested_runs(unsigned w) {

  int counter {0};

  struct A {

    tf::Executor executor;
    tf::Taskflow taskflow;

    int& counter;

    A(unsigned w, int& c) : executor{w}, counter{c} { }

    void run()
    {
      taskflow.clear();
      auto A1 = taskflow.emplace([&]() { counter++; });
      auto A2 = taskflow.emplace([&]() { counter++; });
      A1.precede(A2);
      executor.run_n(taskflow, 10).wait();
    }

  };

  struct B {

    tf::Taskflow taskflow;
    tf::Executor executor;

    int& counter;

    A a_sim;

    B(unsigned w, int& c) : executor{w}, counter{c}, a_sim{w, c} { }

    void run()
    {
      taskflow.clear();
      auto B1 = taskflow.emplace([&] () { ++counter; });
      auto B2 = taskflow.emplace([&] () { ++counter; a_sim.run(); });
      B1.precede(B2);
      executor.run_n(taskflow, 100).wait();
    }
  };

  struct C {

    tf::Taskflow taskflow;
    tf::Executor executor;

    int& counter;

    B b_sim;

    C(unsigned w, int& c) : executor{w}, counter{c}, b_sim{w, c} { }

    void run()
    {
      taskflow.clear();
      auto C1 = taskflow.emplace([&] () { ++counter; });
      auto C2 = taskflow.emplace([&] () { ++counter; b_sim.run(); });
      C1.precede(C2);
      executor.run_n(taskflow, 100).wait();
    }
  };

  C c(w, counter);
  c.run();

  REQUIRE(counter == 220200);
}